

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgp.cpp
# Opt level: O3

bool bgp_update(bgp_peer *peer,uchar *buff,int entire_length)

{
  byte bVar1;
  uint8_t prefix_len_00;
  ushort unfeasible_routes_length;
  ushort total_path_attribute_length;
  node<adj_ribs_in_data> *pnVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  adj_ribs_in_data *paVar6;
  undefined8 *puVar7;
  uint uVar8;
  byte bVar9;
  int prefix_len;
  bool is_updated;
  adj_ribs_in_data route_data;
  adj_ribs_in_data in_stack_fffffffffffffd88;
  uint local_158;
  int local_154;
  char *local_150;
  adj_ribs_in_data local_148;
  
  bVar9 = 0;
  unfeasible_routes_length = *(ushort *)(buff + 0x13) << 8 | *(ushort *)(buff + 0x13) >> 8;
  bgp_update_handle_unfeasible_prefix(peer,buff,unfeasible_routes_length);
  local_148.path_attr.origin = '\0';
  local_148.path_attr.as_path_length = '\0';
  memset(local_148.path_attr.as_path,0,0x114);
  total_path_attribute_length =
       *(ushort *)(buff + (ulong)unfeasible_routes_length + 0x15) << 8 |
       *(ushort *)(buff + (ulong)unfeasible_routes_length + 0x15) >> 8;
  bgp_update_handle_path_attribute
            (peer,buff,unfeasible_routes_length,total_path_attribute_length,&local_148);
  uVar8 = (uint)unfeasible_routes_length + (uint)total_path_attribute_length + 0x17;
  local_154 = entire_length;
  if ((int)uVar8 < entire_length) {
    do {
      bVar1 = buff[uVar8];
      local_158 = (uint)bVar1;
      if (local_158 < 9) {
        uVar5 = (uint)buff[(ulong)uVar8 + 1] << 0x18;
        iVar4 = 2;
      }
      else if (bVar1 < 0x11) {
        uVar5 = (uint)buff[(ulong)uVar8 + 2] << 0x10 | (uint)buff[(ulong)uVar8 + 1] << 0x18;
        iVar4 = 3;
      }
      else if (bVar1 < 0x19) {
        uVar5 = (uint)buff[(ulong)uVar8 + 3] << 8 |
                (uint)buff[(ulong)uVar8 + 2] << 0x10 | (uint)buff[(ulong)uVar8 + 1] << 0x18;
        iVar4 = 4;
      }
      else {
        if (0x20 < bVar1) {
          log<>(ERROR,"Invalid packet");
          return true;
        }
        uVar5 = *(uint *)(buff + (ulong)uVar8 + 1);
        uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        iVar4 = 5;
      }
      local_150 = inet_ntoa((in_addr)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 |
                                      (uVar5 & 0xff00) << 8 | uVar5 << 0x18));
      log<char*,int>(DEBUG,"%s/%d",&local_150,(int *)&local_158);
      pnVar2 = peer->adj_ribs_in;
      prefix_len_00 = (uint8_t)local_158;
      paVar6 = &local_148;
      puVar7 = (undefined8 *)&stack0xfffffffffffffd88;
      for (lVar3 = 0x23; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar7 = *(undefined8 *)&paVar6->path_attr;
        paVar6 = (adj_ribs_in_data *)((long)paVar6 + ((ulong)bVar9 * -2 + 1) * 8);
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
      }
      pnVar2 = add_prefix<adj_ribs_in_data>
                         (pnVar2,uVar5,prefix_len_00,in_stack_fffffffffffffd88,(bool *)&local_150);
      if ((char)local_150 == '\0') {
        peer->route_count = peer->route_count + 1;
      }
      else {
        log<>(DEBUG,"Route updated!");
      }
      uVar8 = uVar8 + iVar4;
      attempt_to_install_bgp_loc_rib(peer,pnVar2);
    } while ((int)uVar8 < local_154);
  }
  return true;
}

Assistant:

bool bgp_update(bgp_peer* peer,  unsigned char* buff, int entire_length){
    uint16_t unfeasible_routes_length;
    memcpy(&unfeasible_routes_length, &buff[19], 2);
    unfeasible_routes_length = ntohs(unfeasible_routes_length);
    int read_length;

    bgp_update_handle_unfeasible_prefix(peer, buff, unfeasible_routes_length);

    adj_ribs_in_data route_data;
    uint16_t total_path_attribute_length;
    memcpy(&total_path_attribute_length, &buff[19 + 2 + unfeasible_routes_length], 2);
    total_path_attribute_length = ntohs(total_path_attribute_length);

    bgp_update_handle_path_attribute(peer, buff, unfeasible_routes_length, total_path_attribute_length, route_data);

    read_length = 19 + 2 + unfeasible_routes_length + 2 + total_path_attribute_length;

    while(read_length < entire_length){
        uint32_t prefix;
        int prefix_len = buff[read_length];
        if(prefix_len <= 8){
            prefix = buff[read_length + 1]*256*256*256;
            read_length += 2;
        }else if(prefix_len <= 16){
            prefix = buff[read_length + 1]*256*256*256 + buff[read_length + 2]*256*256;
            read_length += 3;
        }else if(prefix_len <= 24){
            prefix = buff[read_length + 1]*256*256*256 + buff[read_length + 2]*256*256 + buff[read_length + 3]*256;
            read_length += 4;
        }else if(prefix_len <= 32){
            prefix = buff[read_length + 1]*256*256*256 + buff[read_length + 2]*256*256 + buff[read_length + 3]*256 + buff[read_length + 4];
            read_length += 5;
        }else{
            log(log_level::ERROR, "Invalid packet");
            break;
        }
        log(log_level::DEBUG, "%s/%d", inet_ntoa(in_addr{.s_addr=ntohl(prefix)}), prefix_len);
        bool is_updated;
        node<adj_ribs_in_data>* added = add_prefix(peer->adj_ribs_in, prefix, prefix_len, route_data, &is_updated);
        if(!is_updated){
            peer->route_count++;
        }else{
            log(log_level::DEBUG, "Route updated!");
        }
        attempt_to_install_bgp_loc_rib(peer, added);
    }
    return true;
}